

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.h
# Opt level: O2

BasicTypeInfo<dap::optional<dap::boolean>_> *
dap::TypeInfo::create<dap::BasicTypeInfo<dap::optional<dap::boolean>>,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  BasicTypeInfo<dap::optional<dap::boolean>_> *this;
  
  this = (BasicTypeInfo<dap::optional<dap::boolean>_> *)operator_new(0x28);
  BasicTypeInfo<dap::optional<dap::boolean>_>::BasicTypeInfo(this,args);
  deleteOnExit((TypeInfo *)this);
  return this;
}

Assistant:

static T* create(ARGS&&... args) {
    auto typeinfo = new T(std::forward<ARGS>(args)...);
    deleteOnExit(typeinfo);
    return typeinfo;
  }